

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O3

Fl_Type * __thiscall Fl_Window_Type::make(Fl_Window_Type *this)

{
  Fl_Type **ppFVar1;
  int iVar2;
  int iVar3;
  Fl_Window_Type *this_00;
  Fl_Window *pFVar4;
  Overlay_Window *this_01;
  Fl_Type *p;
  
  p = Fl_Type::current;
  if (Fl_Type::current != (Fl_Type *)0x0) {
    do {
      iVar3 = (*p->_vptr_Fl_Type[0x23])(p);
      if (iVar3 != 0) {
        this_00 = (Fl_Window_Type *)operator_new(0x148);
        Fl_Widget_Type::Fl_Widget_Type((Fl_Widget_Type *)this_00);
        (this_00->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type =
             (_func_int **)&PTR_setlabel_002730f8;
        this_00->dx = 0;
        this_00->dy = 0;
        this_00->drag = 0;
        this_00->sr_min_w = 0;
        this_00->sr_min_h = 0;
        this_00->sr_max_w = 0;
        this_00->sr_max_h = 0;
        pFVar4 = (Fl_Window *)(this->super_Fl_Widget_Type).o;
        if (pFVar4 == (Fl_Window *)0x0) {
          pFVar4 = (Fl_Window *)operator_new(0xf0);
          Fl_Window::Fl_Window(pFVar4,100,100,(char *)0x0);
          (this->super_Fl_Widget_Type).o = (Fl_Widget *)pFVar4;
          Fl_Group::current((Fl_Group *)0x0);
          pFVar4 = (Fl_Window *)(this->super_Fl_Widget_Type).o;
        }
        iVar2 = gridy;
        iVar3 = gridx;
        pFVar4->minw = gridx;
        pFVar4->minh = iVar2;
        pFVar4->maxw = 0xc00;
        pFVar4->maxh = 0x800;
        pFVar4->dw = iVar3;
        pFVar4->dh = iVar2;
        pFVar4->aspect = 0;
        Fl_Window::size_range_(pFVar4);
        (this_00->super_Fl_Widget_Type).super_Fl_Type.factory = (Fl_Type *)this;
        this_00->drag = 0;
        this_00->numselected = 0;
        this_01 = (Overlay_Window *)operator_new(0x100);
        Overlay_Window::Overlay_Window(this_01,100,100);
        this_01->window = this_00;
        (this_00->super_Fl_Widget_Type).o = (Fl_Widget *)this_01;
        Fl_Type::add((Fl_Type *)this_00,p);
        this_00->modal = '\0';
        this_00->non_modal = '\0';
        return (Fl_Type *)this_00;
      }
      ppFVar1 = &p->parent;
      p = *ppFVar1;
    } while (*ppFVar1 != (Fl_Type *)0x0);
  }
  fl_message("Please select a function");
  return (Fl_Type *)0x0;
}

Assistant:

Fl_Type *Fl_Window_Type::make() {
  Fl_Type *p = Fl_Type::current;
  while (p && !p->is_code_block()) p = p->parent;
  if (!p) {
    fl_message("Please select a function");
    return 0;
  }
  Fl_Window_Type *myo = new Fl_Window_Type();
  if (!this->o) {// template widget
    this->o = new Fl_Window(100,100);
    Fl_Group::current(0);
  }
  // Set the size ranges for this window; in order to avoid opening the
  // X display we use an arbitrary maximum size...
  ((Fl_Window *)(this->o))->size_range(gridx, gridy,
                                       3072, 2048,
                                       gridx, gridy, 0);
  myo->factory = this;
  myo->drag = 0;
  myo->numselected = 0;
  Overlay_Window *w = new Overlay_Window(100,100);
  w->window = myo;
  myo->o = w;
  myo->add(p);
  myo->modal = 0;
  myo->non_modal = 0;
  return myo;
}